

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

bool bssl::dtls_has_unprocessed_handshake_data(SSL *ssl)

{
  ushort uVar1;
  bool bVar2;
  ulong local_28;
  size_t i;
  size_t current;
  SSL *ssl_local;
  
  uVar1 = ssl->d1->handshake_read_seq;
  local_28 = 0;
  do {
    if (6 < local_28) {
      return false;
    }
    if (((*(ushort *)&ssl->s3->field_0xdc >> 3 & 1) == 0) ||
       (local_28 != (long)(int)((uint)uVar1 % 7))) {
      bVar2 = std::operator!=(ssl->d1->incoming_messages + local_28,(nullptr_t)0x0);
      if (bVar2) {
        return true;
      }
    }
    else {
      bVar2 = dtls1_is_current_message_complete(ssl);
      if (!bVar2) {
        __assert_fail("dtls1_is_current_message_complete(ssl)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x1d9,"bool bssl::dtls_has_unprocessed_handshake_data(const SSL *)");
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool dtls_has_unprocessed_handshake_data(const SSL *ssl) {
  size_t current = ssl->d1->handshake_read_seq % SSL_MAX_HANDSHAKE_FLIGHT;
  for (size_t i = 0; i < SSL_MAX_HANDSHAKE_FLIGHT; i++) {
    // Skip the current message.
    if (ssl->s3->has_message && i == current) {
      assert(dtls1_is_current_message_complete(ssl));
      continue;
    }
    if (ssl->d1->incoming_messages[i] != nullptr) {
      return true;
    }
  }
  return false;
}